

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptnum_tests.cpp
# Opt level: O0

void __thiscall scriptnum_tests::creation::test_method(creation *this)

{
  long lVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  size_t j;
  size_t i;
  long (*in_stack_ffffffffffffffb8) [13];
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  while( true ) {
    sVar2 = std::size<long,13ul>(in_stack_ffffffffffffffb8);
    if (sVar2 <= local_28) break;
    local_30 = 0;
    while( true ) {
      sVar2 = std::size<long,9ul>((long (*) [9])in_stack_ffffffffffffffb8);
      if (sVar2 <= local_30) break;
      RunCreate((int64_t *)i);
      RunCreate((int64_t *)i);
      RunCreate((int64_t *)i);
      local_30 = local_30 + 1;
    }
    local_28 = local_28 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(creation)
{
    for(size_t i = 0; i < std::size(values); ++i)
    {
        for(size_t j = 0; j < std::size(offsets); ++j)
        {
            RunCreate(values[i]);
            RunCreate(values[i] + offsets[j]);
            RunCreate(values[i] - offsets[j]);
        }
    }
}